

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.cpp
# Opt level: O3

void __thiscall
WordSplitSVTest_three_words_Test<char8_t>::TestBody(WordSplitSVTest_three_words_Test<char8_t> *this)

{
  char *pcVar1;
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  split_result;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> word;
  int local_70 [2];
  long *local_68;
  internal local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_50;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_30;
  
  make_word<char8_t,std::__cxx11::u8string>(&local_30,3,'\0');
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  push_back(&local_30,'\0');
  make_word<char8_t,std::__cxx11::u8string>(&local_50,5,'\0');
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  _M_append(&local_30,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  push_back(&local_30,'\0');
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  push_back(&local_30,'\0');
  make_word<char8_t,std::__cxx11::u8string>(&local_50,9,'\0');
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  _M_append(&local_30,local_50._M_dataplus._M_p,local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  jessilib::word_split<std::vector,_const_char8_t_*,_const_char8_t_*,_char8_t>
            ((container_type_conflict3 *)&local_50,local_30._M_dataplus._M_p,
             local_30._M_dataplus._M_p + local_30._M_string_length,'\0');
  local_68 = (long *)((long)(local_50._M_string_length - (long)local_50._M_dataplus._M_p) >> 5);
  local_70[0] = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result.size()","3",(unsigned_long *)&local_68,local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7c,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_68 = *(long **)(local_50._M_dataplus._M_p + 8);
  local_70[0] = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result[0].size()","3",(unsigned_long *)&local_68,local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_68 = *(long **)(local_50._M_dataplus._M_p + 0x28);
  local_70[0] = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result[1].size()","5",(unsigned_long *)&local_68,local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  local_68 = *(long **)(local_50._M_dataplus._M_p + 0x48);
  local_70[0] = 9;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            (local_60,"split_result[2].size()","9",(unsigned_long *)&local_68,local_70);
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_68);
    if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_58->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/word_split.cpp"
               ,0x7f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_70);
    if (local_68 != (long *)0x0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
  }
  std::
  vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
             *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(WordSplitSVTest, three_words) {
	auto word = make_word<TypeParam>(3);
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(5);
	word += default_delim<TypeParam>;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>(9);
	std::basic_string_view<TypeParam> words = word;
	std::vector<std::basic_string<TypeParam>> split_result = word_split(words, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 3);
	EXPECT_EQ(split_result[0].size(), 3);
	EXPECT_EQ(split_result[1].size(), 5);
	EXPECT_EQ(split_result[2].size(), 9);
}